

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclPrintBufferTrees(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  int local_30;
  int local_2c;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  SC_Man *p_local;
  
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_2c);
    if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBuffer(pObj_00), iVar1 == 0)) &&
       (iVar1 = Abc_SclCountBufferFanouts(pObj_00), 3 < iVar1)) {
      Abc_SclPrintBuffersOne(p,pObj_00,0);
      for (local_30 = 0; iVar1 = Abc_ObjFanoutNum(pObj_00), local_30 < iVar1;
          local_30 = local_30 + 1) {
        pObj_01 = Abc_ObjFanout(pObj_00,local_30);
        iVar1 = Abc_ObjIsBuffer(pObj_01);
        if (iVar1 != 0) {
          Abc_SclPrintBuffersInt(p,pObj_01,1);
        }
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Abc_SclPrintBufferTrees( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsBuffer(pObj) && Abc_SclCountBufferFanouts(pObj) > 3 )
        {           
            Abc_SclPrintBuffersOne( p, pObj, 0 );
            Abc_ObjForEachFanout( pObj, pFanout, k )
                if ( Abc_ObjIsBuffer(pFanout) )
                    Abc_SclPrintBuffersInt( p, pFanout, 1 );
            printf( "\n" );
        }
    }
}